

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O1

void __thiscall
QOffscreenIntegration::QOffscreenIntegration(QOffscreenIntegration *this,QStringList *paramList)

{
  QPlatformFontDatabase *pQVar1;
  QPlatformDrag *pQVar2;
  QPlatformFontDatabase *pQVar3;
  QPlatformDrag *this_00;
  QOffscreenIntegration *pQVar4;
  long in_FS_OFFSET;
  QJsonObject config;
  undefined1 auStack_48 [8];
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_> local_40;
  char local_30;
  QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_> local_28;
  
  local_28.d = *(QPlatformServices **)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QOffscreenIntegration_0011bf50;
  (this->m_fontDatabase).d = (QPlatformFontDatabase *)0x0;
  (this->m_drag).d = (QPlatformDrag *)0x0;
  (this->m_inputContext).d = (QPlatformInputContext *)0x0;
  (this->m_services).d = (QPlatformServices *)0x0;
  (this->m_nativeInterface).d = (QPlatformNativeInterface *)0x0;
  (this->m_screens).d.d = (Data *)0x0;
  (this->m_screens).d.ptr = (QOffscreenScreen **)0x0;
  (this->m_screens).d.size = 0;
  this->m_windowFrameMarginsEnabled = true;
  QJsonObject::QJsonObject(&this->m_configuration);
  pQVar3 = (QPlatformFontDatabase *)operator_new(8);
  *(code **)pQVar3 = QPlatformNativeInterface::windowProperty;
  pQVar1 = (this->m_fontDatabase).d;
  if (pQVar1 != pQVar3) {
    (this->m_fontDatabase).d = pQVar3;
    if (pQVar1 != (QPlatformFontDatabase *)0x0) {
      (**(code **)(*(long *)pQVar1 + 8))();
    }
  }
  this_00 = (QPlatformDrag *)operator_new(0x10);
  QPlatformDrag::QPlatformDrag(this_00);
  *(undefined ***)this_00 = &PTR__QPlatformDrag_0011c090;
  pQVar2 = (this->m_drag).d;
  if ((pQVar2 != this_00) && ((this->m_drag).d = this_00, pQVar2 != (QPlatformDrag *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 8))();
  }
  local_40.d = (QPlatformFontDatabase *)0xaaaaaaaaaaaaaaaa;
  resolveConfigFileConfiguration((QOffscreenIntegration *)&stack0xffffffffffffffc8,paramList);
  defaultConfiguration((QOffscreenIntegration *)auStack_48);
  pQVar4 = (QOffscreenIntegration *)auStack_48;
  if (local_30 != '\0') {
    pQVar4 = (QOffscreenIntegration *)&stack0xffffffffffffffc8;
  }
  QJsonObject::QJsonObject((QJsonObject *)&local_40,(QJsonObject *)pQVar4);
  QJsonObject::~QJsonObject((QJsonObject *)auStack_48);
  if (local_30 == '\x01') {
    local_30 = '\0';
    QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffffc8);
  }
  setConfiguration(this,(QJsonObject *)&local_40);
  QJsonObject::~QJsonObject((QJsonObject *)&local_40);
  if (*(QPlatformServices **)(in_FS_OFFSET + 0x28) == local_28.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenIntegration::QOffscreenIntegration(const QStringList& paramList)
{
#if defined(Q_OS_UNIX)
#if defined(Q_OS_MAC)
    m_fontDatabase.reset(new QCoreTextFontDatabaseEngineFactory<QCoreTextFontEngine>);
#else
    m_fontDatabase.reset(new QGenericUnixFontDatabase());
#endif
#elif defined(Q_OS_WIN)
    m_fontDatabase.reset(new QFreeTypeFontDatabase());
#endif

#if QT_CONFIG(draganddrop)
    m_drag.reset(new QOffscreenDrag);
#endif

    QJsonObject config = resolveConfigFileConfiguration(paramList).value_or(defaultConfiguration());
    setConfiguration(config);
}